

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

int zlib_huflookup(unsigned_long *bitsp,int *nbitsp,zlib_table *tab)

{
  byte *pbVar1;
  zlib_tableentry *ent;
  unsigned_long uStack_30;
  int nbits;
  unsigned_long bits;
  zlib_table *tab_local;
  int *nbitsp_local;
  unsigned_long *bitsp_local;
  
  uStack_30 = *bitsp;
  ent._4_4_ = *nbitsp;
  bits = (unsigned_long)tab;
  while( true ) {
    pbVar1 = (byte *)(*(long *)(bits + 8) + (uStack_30 & (long)*(int *)bits) * 0x10);
    if (ent._4_4_ < (int)(uint)*pbVar1) {
      return -1;
    }
    uStack_30 = uStack_30 >> (*pbVar1 & 0x3f);
    ent._4_4_ = ent._4_4_ - (uint)*pbVar1;
    if (*(short *)(pbVar1 + 2) != -1) break;
    bits = *(unsigned_long *)(pbVar1 + 8);
    if (bits == 0) {
      return -2;
    }
  }
  *bitsp = uStack_30;
  *nbitsp = ent._4_4_;
  return (int)*(short *)(pbVar1 + 2);
}

Assistant:

static int zlib_huflookup(unsigned long *bitsp, int *nbitsp,
                   struct zlib_table *tab)
{
    unsigned long bits = *bitsp;
    int nbits = *nbitsp;
    while (1) {
        struct zlib_tableentry *ent;
        ent = &tab->table[bits & tab->mask];
        if (ent->nbits > nbits)
            return -1;                 /* not enough data */
        bits >>= ent->nbits;
        nbits -= ent->nbits;
        if (ent->code == -1)
            tab = ent->nexttable;
        else {
            *bitsp = bits;
            *nbitsp = nbits;
            return ent->code;
        }

        if (!tab) {
            /*
             * There was a missing entry in the table, presumably
             * due to an invalid Huffman table description, and the
             * subsequent data has attempted to use the missing
             * entry. Return a decoding failure.
             */
            return -2;
        }
    }
}